

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_simple.c
# Opt level: O0

int run_test(EVP_MD_CTX *ctx,OSSL_PROVIDER *prov,EVP_MD *md)

{
  FILE *pFVar1;
  int iVar2;
  uint uVar3;
  uint local_6c;
  uint8_t auStack_68 [4];
  int i;
  uint8_t expected [32];
  char local_3e [8];
  char msg [14];
  uint8_t *out;
  EVP_MD *md_local;
  OSSL_PROVIDER *prov_local;
  EVP_MD_CTX *ctx_local;
  
  builtin_strncpy(local_3e,"Hello, W",8);
  builtin_strncpy(msg,"orld!\n",6);
  _auStack_68 = 0xdb1778ce4b833362;
  expected[0] = '\x1e';
  expected[1] = '@';
  expected[2] = '\x1b';
  expected[3] = 0xce;
  expected[4] = 0xea;
  expected[5] = '+';
  expected[6] = 0x8b;
  expected[7] = 'E';
  expected[8] = 0xc1;
  expected[9] = '`';
  expected[10] = '\x01';
  expected[0xb] = '\x15';
  expected[0xc] = 0xd2;
  expected[0xd] = '[';
  expected[0xe] = 'Q';
  expected[0xf] = 0x90;
  expected[0x10] = 'l';
  expected[0x11] = '\x05';
  expected[0x12] = 0xee;
  expected[0x13] = '2';
  expected[0x14] = '\x15';
  expected[0x15] = 'k';
  expected[0x16] = 'Q';
  expected[0x17] = 0xc2;
  msg._6_8_ = calloc(0x20,1);
  iVar2 = EVP_DigestInit_ex((EVP_MD_CTX *)ctx,(EVP_MD *)md,(ENGINE *)0x0);
  if (iVar2 == 1) {
    iVar2 = EVP_DigestUpdate((EVP_MD_CTX *)ctx,local_3e,0xe);
    if (iVar2 == 1) {
      iVar2 = EVP_DigestFinal_ex((EVP_MD_CTX *)ctx,(uchar *)msg._6_8_,(uint *)0x0);
      if (iVar2 == 1) {
        for (local_6c = 0; local_6c < 0x20; local_6c = local_6c + 1) {
          if (*(uint8_t *)(msg._6_8_ + (long)(int)local_6c) != expected[(long)(int)local_6c + -8]) {
            fprintf(_stderr,"Output doesn\'t match input\n");
            free((void *)msg._6_8_);
            return 1;
          }
        }
        printf("Success!\n");
        free((void *)msg._6_8_);
        ctx_local._4_4_ = 0;
      }
      else {
        ERR_print_errors_fp(_stderr);
        pFVar1 = _stderr;
        uVar3 = EVP_DigestFinal_ex((EVP_MD_CTX *)ctx,(uchar *)msg._6_8_,(uint *)0x0);
        fprintf(pFVar1,"Failed %s:%i %s %i\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/J-Montgomery[P]blake3-prov/test/digest_simple.c"
                ,0x27,"EVP_DigestFinal_ex(ctx, out, NULL)",(ulong)uVar3);
        ctx_local._4_4_ = 1;
      }
    }
    else {
      ERR_print_errors_fp(_stderr);
      pFVar1 = _stderr;
      uVar3 = EVP_DigestUpdate((EVP_MD_CTX *)ctx,local_3e,0xe);
      fprintf(pFVar1,"Failed %s:%i %s %i\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/J-Montgomery[P]blake3-prov/test/digest_simple.c"
              ,0x26,"EVP_DigestUpdate(ctx, msg, sizeof(msg))",(ulong)uVar3);
      ctx_local._4_4_ = 1;
    }
  }
  else {
    ERR_print_errors_fp(_stderr);
    pFVar1 = _stderr;
    uVar3 = EVP_DigestInit_ex((EVP_MD_CTX *)ctx,(EVP_MD *)md,(ENGINE *)0x0);
    fprintf(pFVar1,"Failed %s:%i %s %i\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/J-Montgomery[P]blake3-prov/test/digest_simple.c"
            ,0x25,"EVP_DigestInit_ex(ctx, md, NULL)",(ulong)uVar3);
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

int run_test(EVP_MD_CTX *ctx, OSSL_PROVIDER *prov, EVP_MD *md)
{
	uint8_t *out;

	// "Hello, World!\n"
	const char msg[] = { 0x48, 0x65, 0x6c, 0x6c, 0x6f, 0x2c, 0x20,
			     0x57, 0x6f, 0x72, 0x6c, 0x64, 0x21, 0x0a };
	const uint8_t expected[] = { 0x62, 0x33, 0x83, 0x4b, 0xce, 0x78, 0x17,
				     0xdb, 0x1e, 0x40, 0x1b, 0xce, 0xea, 0x2b,
				     0x8b, 0x45, 0xc1, 0x60, 0x1,  0x15, 0xd2,
				     0x5b, 0x51, 0x90, 0x6c, 0x5,  0xee, 0x32,
				     0x15, 0x6b, 0x51, 0xc2 };

	out = (uint8_t *)calloc(BLAKE3_DIGEST_LENGTH, 1);
	TEST_TRUE(EVP_DigestInit_ex(ctx, md, NULL));
	TEST_TRUE(EVP_DigestUpdate(ctx, msg, sizeof(msg)));
	TEST_TRUE(EVP_DigestFinal_ex(ctx, out, NULL));

	for (int i = 0; i < sizeof(expected); i++) {
		if (out[i] != expected[i]) {
			fprintf(stderr, "Output doesn't match input\n");
			free(out);
			return 1;
		}
	}

	printf("Success!\n");

	free(out);
	return 0;
}